

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkpoint_manager.cpp
# Opt level: O3

void __thiscall
duckdb::SingleFileCheckpointWriter::CreateCheckpoint(SingleFileCheckpointWriter *this)

{
  unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>,_true> *this_00;
  _Head_base<0UL,_duckdb::MetadataWriter_*,_false> _Var1;
  CatalogEntry *pCVar2;
  __int_type _Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Head_base<0UL,_duckdb::DefaultGenerator_*,_false> _Var7;
  int iVar8;
  __uniq_ptr_impl<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>_> _Var9;
  StorageManager *pSVar10;
  type pBVar11;
  MetadataManager *manager;
  _Head_base<0UL,_duckdb::MetadataWriter_*,_false> _Var12;
  pointer pMVar13;
  DuckCatalog *this_01;
  undefined4 extraout_var;
  type stream;
  reference pvVar14;
  pointer pWVar15;
  FatalException *pFVar16;
  size_type sVar17;
  reference_wrapper<duckdb::CatalogEntry> *table;
  __node_base_ptr p_Var18;
  WriteAheadLog *pWVar19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var20;
  undefined1 this_02 [8];
  size_type __n;
  MetaBlockPointer MVar21;
  catalog_entry_vector_t tables;
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> schemas;
  vector<std::reference_wrapper<duckdb::ViewCatalogEntry>,_true> views;
  BinarySerializer serializer;
  undefined1 local_6d8 [32];
  undefined1 local_6b8 [32];
  undefined1 local_698 [32];
  StorageManager *local_678;
  _Head_base<0UL,_duckdb::DefaultGenerator_*,_false> local_670;
  type local_668;
  undefined1 local_660 [40];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_638;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_630;
  _Base_ptr local_628;
  CatalogEntry *local_620;
  __node_base local_618;
  string *local_610;
  _Head_base<0UL,_duckdb::DefaultGenerator_*,_false> local_608;
  __node_base_ptr local_600;
  __node_base_ptr local_5f8;
  _Any_data local_5f0;
  code *local_5e0;
  code *local_5d8;
  DefaultGenerator *pDStack_5c8;
  idx_t local_5b0;
  undefined8 uStack_5a8;
  SerializationOptions local_598;
  undefined1 local_560 [8];
  SerializationOptions local_558 [12];
  vector<duckdb::BinarySerializer::DebugState,_std::allocator<duckdb::BinarySerializer::DebugState>_>
  local_2b8;
  _Deque_base<std::reference_wrapper<duckdb::ClientContext>,_std::allocator<std::reference_wrapper<duckdb::ClientContext>_>_>
  local_298;
  _Deque_base<std::reference_wrapper<duckdb::DatabaseInstance>,_std::allocator<std::reference_wrapper<duckdb::DatabaseInstance>_>_>
  local_248;
  _Deque_base<std::reference_wrapper<duckdb::Catalog>,_std::allocator<std::reference_wrapper<duckdb::Catalog>_>_>
  local_1f8;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_1a8;
  _Deque_base<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>,_std::allocator<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>_>_>
  local_158;
  _Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
  local_108;
  _Deque_base<std::reference_wrapper<const_duckdb::CompressionInfo>,_std::allocator<std::reference_wrapper<const_duckdb::CompressionInfo>_>_>
  local_b8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::deque<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::allocator<std::reference_wrapper<duckdb::SerializationData::CustomData>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::deque<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::allocator<std::reference_wrapper<duckdb::SerializationData::CustomData>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  _Var9._M_t.
  super__Tuple_impl<0UL,_duckdb::DefaultGenerator_*,_std::default_delete<duckdb::DefaultGenerator>_>
  .super__Head_base<0UL,_duckdb::DefaultGenerator_*,_false>._M_head_impl =
       (tuple<duckdb::DefaultGenerator_*,_std::default_delete<duckdb::DefaultGenerator>_>)
       DBConfig::Get((this->super_CheckpointWriter).db);
  pSVar10 = AttachedDatabase::GetStorageManager((this->super_CheckpointWriter).db);
  iVar8 = ::std::__cxx11::string::compare((char *)&pSVar10->path);
  if (iVar8 != 0) {
    local_678 = pSVar10;
    local_610 = &pSVar10->path;
    local_608._M_head_impl =
         (DefaultGenerator *)
         _Var9._M_t.
         super__Tuple_impl<0UL,_duckdb::DefaultGenerator_*,_std::default_delete<duckdb::DefaultGenerator>_>
         .super__Head_base<0UL,_duckdb::DefaultGenerator_*,_false>._M_head_impl;
    pSVar10 = AttachedDatabase::GetStorageManager((this->super_CheckpointWriter).db);
    pBVar11 = unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
              operator*((unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>
                         *)(pSVar10 + 1));
    manager = GetMetadataManager(this);
    _Var12._M_head_impl = (MetadataWriter *)operator_new(0x50);
    MetadataWriter::MetadataWriter
              (_Var12._M_head_impl,manager,
               (optional_ptr<duckdb::vector<duckdb::MetaBlockPointer,_true>,_true>)0x0);
    _Var1._M_head_impl =
         (this->metadata_writer).
         super_unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>._M_t
         .
         super___uniq_ptr_impl<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::MetadataWriter_*,_std::default_delete<duckdb::MetadataWriter>_>
         .super__Head_base<0UL,_duckdb::MetadataWriter_*,_false>._M_head_impl;
    (this->metadata_writer).
    super_unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>._M_t.
    super___uniq_ptr_impl<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::MetadataWriter_*,_std::default_delete<duckdb::MetadataWriter>_>.
    super__Head_base<0UL,_duckdb::MetadataWriter_*,_false>._M_head_impl = _Var12._M_head_impl;
    if (_Var1._M_head_impl != (MetadataWriter *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_WriteStream + 0x10))();
    }
    _Var12._M_head_impl = (MetadataWriter *)operator_new(0x50);
    MetadataWriter::MetadataWriter
              (_Var12._M_head_impl,manager,
               (optional_ptr<duckdb::vector<duckdb::MetaBlockPointer,_true>,_true>)0x0);
    local_660._0_8_ = &this->metadata_writer;
    _Var1._M_head_impl =
         (this->table_metadata_writer).
         super_unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>._M_t
         .
         super___uniq_ptr_impl<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::MetadataWriter_*,_std::default_delete<duckdb::MetadataWriter>_>
         .super__Head_base<0UL,_duckdb::MetadataWriter_*,_false>._M_head_impl;
    (this->table_metadata_writer).
    super_unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>._M_t.
    super___uniq_ptr_impl<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::MetadataWriter_*,_std::default_delete<duckdb::MetadataWriter>_>.
    super__Head_base<0UL,_duckdb::MetadataWriter_*,_false>._M_head_impl = _Var12._M_head_impl;
    if (_Var1._M_head_impl != (MetadataWriter *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_WriteStream + 0x10))();
    }
    pMVar13 = unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>,_true>
              ::operator->((unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>,_true>
                            *)local_660._0_8_);
    MVar21 = MetadataWriter::GetMetaBlockPointer(pMVar13);
    local_618._M_nxt = MVar21._8_8_;
    local_670._M_head_impl = (DefaultGenerator *)MVar21.block_pointer;
    local_660._8_8_ = (void *)0x0;
    local_660._16_8_ = (void *)0x0;
    local_660._24_8_ = (__pthread_internal_list *)0x0;
    this_01 = (DuckCatalog *)Catalog::GetCatalog((this->super_CheckpointWriter).db);
    local_5f0._8_8_ = 0;
    local_5f0._M_unused._0_8_ = (undefined8)(local_660 + 8);
    local_5d8 = ::std::
                _Function_handler<void_(duckdb::SchemaCatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/storage/checkpoint_manager.cpp:153:22)>
                ::_M_invoke;
    local_5e0 = ::std::
                _Function_handler<void_(duckdb::SchemaCatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/storage/checkpoint_manager.cpp:153:22)>
                ::_M_manager;
    DuckCatalog::ScanSchemas(this_01,(function<void_(duckdb::SchemaCatalogEntry_&)> *)&local_5f0);
    if (local_5e0 != (code *)0x0) {
      (*local_5e0)(&local_5f0,&local_5f0,__destroy_functor);
    }
    local_698._0_8_ = (pointer)0x0;
    local_698._8_8_ = (_Base_ptr)0x0;
    local_698._16_8_ = (_Base_ptr)0x0;
    local_668 = pBVar11;
    iVar8 = (*(this_01->super_Catalog)._vptr_Catalog[0x1a])(this_01);
    local_560 = (undefined1  [8])CONCAT44(extraout_var,iVar8);
    optional_ptr<duckdb::DependencyManager,_true>::CheckValid
              ((optional_ptr<duckdb::DependencyManager,_true> *)local_560);
    local_6d8._0_4_ = 0;
    local_6d8._4_4_ = 0;
    local_6d8._8_4_ = 0;
    local_6d8._12_4_ = 0;
    local_6d8._0_8_ = (DuckCatalog *)0x0;
    local_6d8._8_8_ = (DuckCatalog *)0x0;
    local_6d8._16_8_ = (reference_wrapper<duckdb::CatalogEntry> *)0x0;
    local_600 = (__node_base_ptr)local_660._16_8_;
    if (local_660._8_8_ == local_660._16_8_) {
      local_698._16_8_ = (_Base_ptr)0x0;
      this_02 = local_560;
    }
    else {
      local_620 = (CatalogEntry *)local_560;
      p_Var18 = (__node_base_ptr)local_660._8_8_;
      do {
        pCVar2 = (CatalogEntry *)p_Var18->_M_nxt;
        if (local_6d8._8_8_ == local_6d8._16_8_) {
          local_560 = (undefined1  [8])pCVar2;
          ::std::
          vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>
          ::_M_realloc_insert<std::reference_wrapper<duckdb::CatalogEntry>>
                    ((vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>
                      *)local_6d8,(iterator)local_6d8._8_8_,
                     (reference_wrapper<duckdb::CatalogEntry> *)local_560);
        }
        else {
          *(CatalogEntry **)local_6d8._8_8_ = pCVar2;
          local_6d8._8_8_ = local_6d8._8_8_ + 8;
        }
        local_558[0].serialize_enum_as_string = false;
        local_558[0].serialize_default_values = false;
        local_558[0]._2_6_ = 0;
        local_558[0].serialization_compatibility.duckdb_version._M_string_length =
             (size_type)
             ::std::
             _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/storage/checkpoint_manager.cpp:68:40)>
             ::_M_invoke;
        local_558[0].serialization_compatibility.duckdb_version._M_dataplus._M_p =
             (pointer)::std::
                      _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/storage/checkpoint_manager.cpp:68:40)>
                      ::_M_manager;
        local_560 = (undefined1  [8])local_6d8;
        (*pCVar2->_vptr_CatalogEntry[0x11])
                  (pCVar2,8,(reference_wrapper<duckdb::CatalogEntry> *)local_560);
        if ((code *)local_558[0].serialization_compatibility.duckdb_version._M_dataplus._M_p !=
            (code *)0x0) {
          (*(code *)local_558[0].serialization_compatibility.duckdb_version._M_dataplus._M_p)
                    ((reference_wrapper<duckdb::CatalogEntry> *)local_560,
                     (reference_wrapper<duckdb::CatalogEntry> *)local_560,3);
        }
        local_558[0].serialize_enum_as_string = false;
        local_558[0].serialize_default_values = false;
        local_558[0]._2_6_ = 0;
        local_558[0].serialization_compatibility.duckdb_version._M_string_length =
             (size_type)
             ::std::
             _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/storage/checkpoint_manager.cpp:75:44)>
             ::_M_invoke;
        local_558[0].serialization_compatibility.duckdb_version._M_dataplus._M_p =
             (pointer)::std::
                      _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/storage/checkpoint_manager.cpp:75:44)>
                      ::_M_manager;
        local_560 = (undefined1  [8])local_6d8;
        (*pCVar2->_vptr_CatalogEntry[0x11])
                  (pCVar2,6,(reference_wrapper<duckdb::CatalogEntry> *)local_560);
        if ((code *)local_558[0].serialization_compatibility.duckdb_version._M_dataplus._M_p !=
            (code *)0x0) {
          (*(code *)local_558[0].serialization_compatibility.duckdb_version._M_dataplus._M_p)
                    ((reference_wrapper<duckdb::CatalogEntry> *)local_560,
                     (reference_wrapper<duckdb::CatalogEntry> *)local_560,3);
        }
        local_6b8._16_8_ = (__pthread_internal_list *)0x0;
        local_6b8._0_8_ = (WriteAheadLog *)0x0;
        local_6b8._8_8_ = (WriteAheadLog *)0x0;
        local_628 = (_Base_ptr)0x0;
        local_638 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        _Stack_630._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_560 = (undefined1  [8])local_6b8;
        local_558[0]._0_8_ = &local_638;
        local_558[0].serialization_compatibility.duckdb_version._M_string_length =
             (size_type)
             ::std::
             _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/storage/checkpoint_manager.cpp:84:41)>
             ::_M_invoke;
        local_558[0].serialization_compatibility.duckdb_version._M_dataplus._M_p =
             (pointer)::std::
                      _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/storage/checkpoint_manager.cpp:84:41)>
                      ::_M_manager;
        (*pCVar2->_vptr_CatalogEntry[0x11])
                  (pCVar2,1,(reference_wrapper<duckdb::CatalogEntry> *)local_560);
        if ((code *)local_558[0].serialization_compatibility.duckdb_version._M_dataplus._M_p !=
            (code *)0x0) {
          (*(code *)local_558[0].serialization_compatibility.duckdb_version._M_dataplus._M_p)
                    ((reference_wrapper<duckdb::CatalogEntry> *)local_560,
                     (reference_wrapper<duckdb::CatalogEntry> *)local_560,3);
        }
        local_5f8 = p_Var18;
        ReorderTableEntries((catalog_entry_vector_t *)local_6b8);
        uVar4 = local_6b8._8_8_;
        for (pWVar19 = (WriteAheadLog *)local_6b8._0_8_; _Var6._M_pi = _Stack_630._M_pi,
            p_Var20 = local_638, pWVar19 != (WriteAheadLog *)uVar4;
            pWVar19 = (WriteAheadLog *)&pWVar19->database) {
          local_560 = (undefined1  [8])pWVar19->_vptr_WriteAheadLog;
          if (local_6d8._8_8_ == local_6d8._16_8_) {
            ::std::
            vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>
            ::_M_realloc_insert<std::reference_wrapper<duckdb::CatalogEntry>>
                      ((vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>
                        *)local_6d8,(iterator)local_6d8._8_8_,
                       (reference_wrapper<duckdb::CatalogEntry> *)local_560);
          }
          else {
            *(CatalogEntry **)local_6d8._8_8_ = (CatalogEntry *)local_560;
            local_6d8._8_8_ = local_6d8._8_8_ + 8;
          }
        }
        for (; p_Var20 != _Var6._M_pi;
            p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&p_Var20->_M_use_count) {
          local_560 = (undefined1  [8])p_Var20->_vptr__Sp_counted_base;
          if (local_6d8._8_8_ == local_6d8._16_8_) {
            ::std::
            vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>
            ::_M_realloc_insert<std::reference_wrapper<duckdb::CatalogEntry>>
                      ((vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>
                        *)local_6d8,(iterator)local_6d8._8_8_,
                       (reference_wrapper<duckdb::CatalogEntry> *)local_560);
          }
          else {
            *(CatalogEntry **)local_6d8._8_8_ = (CatalogEntry *)local_560;
            local_6d8._8_8_ = local_6d8._8_8_ + 8;
          }
        }
        local_558[0].serialize_enum_as_string = false;
        local_558[0].serialize_default_values = false;
        local_558[0]._2_6_ = 0;
        local_558[0].serialization_compatibility.duckdb_version._M_string_length =
             (size_type)
             ::std::
             _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/storage/checkpoint_manager.cpp:105:51)>
             ::_M_invoke;
        local_558[0].serialization_compatibility.duckdb_version._M_dataplus._M_p =
             (pointer)::std::
                      _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/storage/checkpoint_manager.cpp:105:51)>
                      ::_M_manager;
        local_560 = (undefined1  [8])local_6d8;
        (*pCVar2->_vptr_CatalogEntry[0x11])
                  (pCVar2,0x1a,(reference_wrapper<duckdb::CatalogEntry> *)local_560);
        p_Var18 = local_5f8;
        if ((code *)local_558[0].serialization_compatibility.duckdb_version._M_dataplus._M_p !=
            (code *)0x0) {
          (*(code *)local_558[0].serialization_compatibility.duckdb_version._M_dataplus._M_p)
                    ((reference_wrapper<duckdb::CatalogEntry> *)local_560,
                     (reference_wrapper<duckdb::CatalogEntry> *)local_560,3);
        }
        local_558[0].serialize_enum_as_string = false;
        local_558[0].serialize_default_values = false;
        local_558[0]._2_6_ = 0;
        local_558[0].serialization_compatibility.duckdb_version._M_string_length =
             (size_type)
             ::std::
             _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/storage/checkpoint_manager.cpp:114:50)>
             ::_M_invoke;
        local_558[0].serialization_compatibility.duckdb_version._M_dataplus._M_p =
             (pointer)::std::
                      _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/storage/checkpoint_manager.cpp:114:50)>
                      ::_M_manager;
        local_560 = (undefined1  [8])local_6d8;
        (*pCVar2->_vptr_CatalogEntry[0x11])
                  (pCVar2,0x19,(reference_wrapper<duckdb::CatalogEntry> *)local_560);
        if ((code *)local_558[0].serialization_compatibility.duckdb_version._M_dataplus._M_p !=
            (code *)0x0) {
          (*(code *)local_558[0].serialization_compatibility.duckdb_version._M_dataplus._M_p)
                    ((reference_wrapper<duckdb::CatalogEntry> *)local_560,
                     (reference_wrapper<duckdb::CatalogEntry> *)local_560,3);
        }
        local_558[0].serialize_enum_as_string = false;
        local_558[0].serialize_default_values = false;
        local_558[0]._2_6_ = 0;
        local_558[0].serialization_compatibility.duckdb_version._M_string_length =
             (size_type)
             ::std::
             _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/storage/checkpoint_manager.cpp:123:41)>
             ::_M_invoke;
        local_558[0].serialization_compatibility.duckdb_version._M_dataplus._M_p =
             (pointer)::std::
                      _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/storage/checkpoint_manager.cpp:123:41)>
                      ::_M_manager;
        local_560 = (undefined1  [8])local_6d8;
        (*pCVar2->_vptr_CatalogEntry[0x11])
                  (pCVar2,4,(reference_wrapper<duckdb::CatalogEntry> *)local_560);
        if ((code *)local_558[0].serialization_compatibility.duckdb_version._M_dataplus._M_p !=
            (code *)0x0) {
          (*(code *)local_558[0].serialization_compatibility.duckdb_version._M_dataplus._M_p)
                    ((reference_wrapper<duckdb::CatalogEntry> *)local_560,
                     (reference_wrapper<duckdb::CatalogEntry> *)local_560,3);
        }
        if (local_638 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          operator_delete(local_638);
        }
        if ((WriteAheadLog *)local_6b8._0_8_ != (WriteAheadLog *)0x0) {
          operator_delete((void *)local_6b8._0_8_);
        }
        p_Var18 = p_Var18 + 1;
      } while (p_Var18 != local_600);
      local_698._16_8_ = local_6d8._16_8_;
      this_02 = (undefined1  [8])local_620;
    }
    uVar5 = local_660._0_8_;
    uVar4 = local_698._0_8_;
    local_698._4_4_ = local_6d8._4_4_;
    local_698._0_4_ = local_6d8._0_4_;
    local_698._12_4_ = local_6d8._12_4_;
    local_698._8_4_ = local_6d8._8_4_;
    local_6d8._0_8_ = (DuckCatalog *)0x0;
    local_6d8._8_8_ = (DuckCatalog *)0x0;
    local_6d8._16_8_ = 0;
    if (((pointer)uVar4 != (pointer)0x0) &&
       (operator_delete((void *)uVar4), (DuckCatalog *)local_6d8._0_8_ != (DuckCatalog *)0x0)) {
      operator_delete((void *)local_6d8._0_8_);
    }
    DependencyManager::ReorderEntries
              ((DependencyManager *)this_02,(catalog_entry_vector_t *)local_698);
    stream = unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>,_true>::
             operator*((unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>,_true>
                        *)uVar5);
    SerializationOptions::SerializationOptions(&local_598,(this->super_CheckpointWriter).db);
    BinarySerializer::BinarySerializer
              ((BinarySerializer *)local_560,&stream->super_WriteStream,&local_598);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_598.serialization_compatibility.duckdb_version._M_dataplus._M_p !=
        &local_598.serialization_compatibility.duckdb_version.field_2) {
      operator_delete(local_598.serialization_compatibility.duckdb_version._M_dataplus._M_p);
    }
    BinarySerializer::OnObjectBegin((BinarySerializer *)local_560);
    uVar5 = local_698._8_8_;
    uVar4 = local_698._0_8_;
    (*(code *)(((mutex *)((long)local_560 + 0x10))->super___mutex_base)._M_mutex.__align)
              (local_560,100,"catalog_entries");
    sVar17 = (long)(uVar5 - uVar4) >> 3;
    (**(code **)&((_Rb_tree_header *)((long)local_560 + 0x40))->_M_header)(local_560,sVar17);
    if (uVar5 != uVar4) {
      __n = 0;
      do {
        pvVar14 = vector<std::reference_wrapper<duckdb::CatalogEntry>,_true>::operator[]
                            ((vector<std::reference_wrapper<duckdb::CatalogEntry>,_true> *)local_698
                             ,__n);
        (*(code *)(((string *)((long)local_560 + 0x20))->field_2)._M_allocated_capacity)
                  ((Serializer *)local_560);
        CheckpointWriter::WriteEntry
                  (&this->super_CheckpointWriter,pvVar14->_M_data,(Serializer *)local_560);
        (**(code **)((long)&((string *)((long)local_560 + 0x20))->field_2 + 8))
                  ((Serializer *)local_560);
        __n = __n + 1;
      } while (sVar17 != __n);
    }
    (*(code *)(((atomic<unsigned_long> *)((long)local_560 + 0x48))->
              super___atomic_base<unsigned_long>)._M_i)();
    (*(code *)((optional_ptr<duckdb::CatalogSet,_true> *)((long)local_560 + 0x18))->ptr)();
    BinarySerializer::OnObjectEnd((BinarySerializer *)local_560);
    pMVar13 = unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>,_true>
              ::operator->((unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>,_true>
                            *)local_660._0_8_);
    MetadataWriter::Flush(pMVar13);
    pMVar13 = unique_ptr<duckdb::MetadataWriter,_std::default_delete<duckdb::MetadataWriter>,_true>
              ::operator->(&this->table_metadata_writer);
    MetadataWriter::Flush(pMVar13);
    this_00 = &local_678->wal;
    pWVar15 = unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>,_true>::
              operator->(this_00);
    _Var7._M_head_impl = local_608._M_head_impl;
    _Var3 = (pWVar15->wal_size).super___atomic_base<unsigned_long>._M_i;
    if (_Var3 != 0) {
      iVar8 = ::std::__cxx11::string::compare((char *)local_610);
      if (((iVar8 == 0) || (local_678->read_only != false)) || (local_678->load_complete == false))
      {
        local_6b8._0_8_ = (WriteAheadLog *)0x0;
      }
      else {
        local_6b8._0_8_ =
             (local_678->wal).
             super_unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::WriteAheadLog_*,_std::default_delete<duckdb::WriteAheadLog>_>
             .super__Head_base<0UL,_duckdb::WriteAheadLog_*,_false>._M_head_impl;
      }
      optional_ptr<duckdb::WriteAheadLog,_true>::CheckValid
                ((optional_ptr<duckdb::WriteAheadLog,_true> *)local_6b8);
      MVar21._8_8_ = local_618._M_nxt;
      MVar21.block_pointer = (idx_t)local_670._M_head_impl;
      WriteAheadLog::WriteCheckpoint((WriteAheadLog *)local_6b8._0_8_,MVar21);
      optional_ptr<duckdb::WriteAheadLog,_true>::CheckValid
                ((optional_ptr<duckdb::WriteAheadLog,_true> *)local_6b8);
      WriteAheadLog::Flush((WriteAheadLog *)local_6b8._0_8_);
    }
    pBVar11 = local_668;
    if (_Var7._M_head_impl[0x17].created_all_entries._M_base._M_i == true) {
      pFVar16 = (FatalException *)__cxa_allocate_exception(0x10);
      local_6b8._0_8_ = local_6b8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_6b8,
                 "Checkpoint aborted before header write because of PRAGMA checkpoint_abort flag",""
                );
      FatalException::FatalException(pFVar16,FATAL,(string *)local_6b8);
      __cxa_throw(pFVar16,&FatalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_5b0 = optional_idx::GetIndex(&local_668->block_alloc_size);
    pDStack_5c8 = local_670._M_head_impl;
    uStack_5a8 = 0x800;
    (*pBVar11->_vptr_BlockManager[0xf])(pBVar11);
    if (_Var7._M_head_impl[0x17].created_all_entries._M_base._M_i == true) {
      pFVar16 = (FatalException *)__cxa_allocate_exception(0x10);
      local_6b8._0_8_ = local_6b8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_6b8,
                 "Checkpoint aborted before truncate because of PRAGMA checkpoint_abort flag","");
      FatalException::FatalException(pFVar16,FATAL,(string *)local_6b8);
      __cxa_throw(pFVar16,&FatalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    (*local_668->_vptr_BlockManager[0x15])();
    if (_Var3 != 0) {
      pWVar15 = unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>,_true>
                ::operator->(this_00);
      WriteAheadLog::Delete(pWVar15);
    }
    local_560 = (undefined1  [8])&PTR__BinarySerializer_02455030;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::deque<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::allocator<std::reference_wrapper<duckdb::SerializationData::CustomData>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::stack<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::deque<std::reference_wrapper<duckdb::SerializationData::CustomData>,_std::allocator<std::reference_wrapper<duckdb::SerializationData::CustomData>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_68);
    ::std::
    _Deque_base<std::reference_wrapper<const_duckdb::CompressionInfo>,_std::allocator<std::reference_wrapper<const_duckdb::CompressionInfo>_>_>
    ::~_Deque_base(&local_b8);
    ::std::
    _Deque_base<std::reference_wrapper<const_duckdb::LogicalType>,_std::allocator<std::reference_wrapper<const_duckdb::LogicalType>_>_>
    ::~_Deque_base(&local_108);
    ::std::
    _Deque_base<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>,_std::allocator<std::reference_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>_>_>_>_>
    ::~_Deque_base(&local_158);
    ::std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_1a8);
    ::std::
    _Deque_base<std::reference_wrapper<duckdb::Catalog>,_std::allocator<std::reference_wrapper<duckdb::Catalog>_>_>
    ::~_Deque_base(&local_1f8);
    ::std::
    _Deque_base<std::reference_wrapper<duckdb::DatabaseInstance>,_std::allocator<std::reference_wrapper<duckdb::DatabaseInstance>_>_>
    ::~_Deque_base(&local_248);
    ::std::
    _Deque_base<std::reference_wrapper<duckdb::ClientContext>,_std::allocator<std::reference_wrapper<duckdb::ClientContext>_>_>
    ::~_Deque_base(&local_298);
    ::std::
    vector<duckdb::BinarySerializer::DebugState,_std::allocator<duckdb::BinarySerializer::DebugState>_>
    ::~vector(&local_2b8);
    Serializer::~Serializer((Serializer *)local_560);
    if ((_Base_ptr)local_698._0_8_ != (_Base_ptr)0x0) {
      operator_delete((void *)local_698._0_8_);
    }
    if ((void *)local_660._8_8_ != (void *)0x0) {
      operator_delete((void *)local_660._8_8_);
    }
  }
  return;
}

Assistant:

void SingleFileCheckpointWriter::CreateCheckpoint() {
	auto &config = DBConfig::Get(db);
	auto &storage_manager = db.GetStorageManager().Cast<SingleFileStorageManager>();
	if (storage_manager.InMemory()) {
		return;
	}
	// assert that the checkpoint manager hasn't been used before
	D_ASSERT(!metadata_writer);

	auto &block_manager = GetBlockManager();
	auto &metadata_manager = GetMetadataManager();

	//! Set up the writers for the checkpoints
	metadata_writer = make_uniq<MetadataWriter>(metadata_manager);
	table_metadata_writer = make_uniq<MetadataWriter>(metadata_manager);

	// get the id of the first meta block
	auto meta_block = metadata_writer->GetMetaBlockPointer();

	vector<reference<SchemaCatalogEntry>> schemas;
	// we scan the set of committed schemas
	auto &catalog = Catalog::GetCatalog(db).Cast<DuckCatalog>();
	catalog.ScanSchemas([&](SchemaCatalogEntry &entry) { schemas.push_back(entry); });

	catalog_entry_vector_t catalog_entries;
	D_ASSERT(catalog.IsDuckCatalog());

	auto &dependency_manager = *catalog.GetDependencyManager();
	catalog_entries = GetCatalogEntries(schemas);
	dependency_manager.ReorderEntries(catalog_entries);

	// write the actual data into the database

	// Create a serializer to write the checkpoint data
	// The serialized format is roughly:
	/*
	    {
	        schemas: [
	            {
	                schema: <schema_info>,
	                custom_types: [ { type: <type_info> }, ... ],
	                sequences: [ { sequence: <sequence_info> }, ... ],
	                tables: [ { table: <table_info> }, ... ],
	                views: [ { view: <view_info> }, ... ],
	                macros: [ { macro: <macro_info> }, ... ],
	                table_macros: [ { table_macro: <table_macro_info> }, ... ],
	                indexes: [ { index: <index_info>, root_offset <block_ptr> }, ... ]
	            }
	        ]
	    }
	 */
	BinarySerializer serializer(*metadata_writer, SerializationOptions(db));
	serializer.Begin();
	serializer.WriteList(100, "catalog_entries", catalog_entries.size(), [&](Serializer::List &list, idx_t i) {
		auto &entry = catalog_entries[i];
		list.WriteObject([&](Serializer &obj) { WriteEntry(entry.get(), obj); });
	});
	serializer.End();

	metadata_writer->Flush();
	table_metadata_writer->Flush();

	// write a checkpoint flag to the WAL
	// this protects against the rare event that the database crashes AFTER writing the file, but BEFORE truncating the
	// WAL we write an entry CHECKPOINT "meta_block_id" into the WAL upon loading, if we see there is an entry
	// CHECKPOINT "meta_block_id", and the id MATCHES the head idin the file we know that the database was successfully
	// checkpointed, so we know that we should avoid replaying the WAL to avoid duplicating data
	bool wal_is_empty = storage_manager.GetWALSize() == 0;
	if (!wal_is_empty) {
		auto wal = storage_manager.GetWAL();
		wal->WriteCheckpoint(meta_block);
		wal->Flush();
	}

	if (config.options.checkpoint_abort == CheckpointAbort::DEBUG_ABORT_BEFORE_HEADER) {
		throw FatalException("Checkpoint aborted before header write because of PRAGMA checkpoint_abort flag");
	}

	// finally write the updated header
	DatabaseHeader header;
	header.meta_block = meta_block.block_pointer;
	header.block_alloc_size = block_manager.GetBlockAllocSize();
	header.vector_size = STANDARD_VECTOR_SIZE;
	block_manager.WriteHeader(header);

#ifdef DUCKDB_BLOCK_VERIFICATION
	// extend verify_block_usage_count
	auto metadata_info = storage_manager.GetMetadataInfo();
	for (auto &info : metadata_info) {
		verify_block_usage_count[info.block_id]++;
	}
	for (auto &entry_ref : catalog_entries) {
		auto &entry = entry_ref.get();
		if (entry.type == CatalogType::TABLE_ENTRY) {
			auto &table = entry.Cast<DuckTableEntry>();
			auto &storage = table.GetStorage();
			auto segment_info = storage.GetColumnSegmentInfo();
			for (auto &segment : segment_info) {
				verify_block_usage_count[segment.block_id]++;
				if (StringUtil::Contains(segment.segment_info, "Overflow String Block Ids: ")) {
					auto overflow_blocks = StringUtil::Replace(segment.segment_info, "Overflow String Block Ids: ", "");
					auto splits = StringUtil::Split(overflow_blocks, ", ");
					for (auto &split : splits) {
						auto overflow_block_id = std::stoll(split);
						verify_block_usage_count[overflow_block_id]++;
					}
				}
			}
		}
	}
	block_manager.VerifyBlocks(verify_block_usage_count);
#endif

	if (config.options.checkpoint_abort == CheckpointAbort::DEBUG_ABORT_BEFORE_TRUNCATE) {
		throw FatalException("Checkpoint aborted before truncate because of PRAGMA checkpoint_abort flag");
	}

	// truncate the file
	block_manager.Truncate();

	// truncate the WAL
	if (!wal_is_empty) {
		storage_manager.ResetWAL();
	}
}